

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

int private_connect(SOCKET sockfd,sockaddr *serv_addr,socklen_t addrlen)

{
  int connect_res;
  undefined4 local_20;
  int ret;
  socklen_t addrlen_local;
  sockaddr *serv_addr_local;
  SOCKET sockfd_local;
  
  local_20 = sock_make_no_blocking(sockfd);
  if (local_20 != -1) {
    connect_res = connect(sockfd,(sockaddr *)serv_addr,addrlen);
    local_20 = Check_Connect_And_Wait_Connection(sockfd,connect_res);
    if (local_20 != -1) {
      local_20 = sock_make_blocking(sockfd);
    }
  }
  return local_20;
}

Assistant:

static int private_connect(
	SOCKET sockfd, const struct sockaddr *serv_addr, socklen_t addrlen)
{
#ifndef UPNP_ENABLE_BLOCKING_TCP_CONNECTIONS
	int ret = sock_make_no_blocking(sockfd);
	if (ret != -1) {
		ret = connect(sockfd, serv_addr, addrlen);
		ret = Check_Connect_And_Wait_Connection(sockfd, ret);
		if (ret != -1) {
			ret = sock_make_blocking(sockfd);
		}
	}

	return ret;
#else
	return connect(sockfd, serv_addr, addrlen);
#endif /* UPNP_ENABLE_BLOCKING_TCP_CONNECTIONS */
}